

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

void __thiscall
wasm::Debug::AddrExprMap::add(AddrExprMap *this,Expression *expr,DelimiterLocations *delimiter)

{
  size_t sVar1;
  uint *puVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  uint local_24;
  Index i;
  DelimiterLocations *delimiter_local;
  Expression *expr_local;
  AddrExprMap *this_local;
  
  local_24 = 0;
  do {
    sVar1 = SmallVector<unsigned_int,_1UL>::size(&delimiter->super_SmallVector<unsigned_int,_1UL>);
    if (sVar1 <= local_24) {
      return;
    }
    puVar2 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](delimiter,(ulong)local_24);
    if (*puVar2 != 0) {
      puVar2 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](delimiter,(ulong)local_24);
      sVar3 = std::
              unordered_map<unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>_>
              ::count(&this->delimiterMap,puVar2);
      if (sVar3 != 0) {
        __assert_fail("delimiterMap.count(delimiter[i]) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                      ,0x1a9,
                      "void wasm::Debug::AddrExprMap::add(Expression *, const BinaryLocations::DelimiterLocations &)"
                     );
      }
      puVar2 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](delimiter,(ulong)local_24);
      pmVar4 = std::
               unordered_map<unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>_>
               ::operator[](&this->delimiterMap,puVar2);
      pmVar4->expr = expr;
      pmVar4->id = (ulong)local_24;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void add(Expression* expr,
           const BinaryLocations::DelimiterLocations& delimiter) {
    for (Index i = 0; i < delimiter.size(); i++) {
      if (delimiter[i] != 0) {
        assert(delimiterMap.count(delimiter[i]) == 0);
        delimiterMap[delimiter[i]] = DelimiterInfo{expr, i};
      }
    }
  }